

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

int linenoiseEnableRawMode(int fd)

{
  int iVar1;
  int *piVar2;
  undefined1 auStack_58 [8];
  termios raw;
  
  iVar1 = isatty(0);
  if (iVar1 != 0) {
    if (atexit_registered == '\0') {
      atexit(linenoiseAtExit);
      atexit_registered = '\x01';
    }
    iVar1 = tcgetattr(fd,(termios *)&orig_termios);
    if (iVar1 != -1) {
      raw.c_line = orig_termios.c_cc[7];
      raw.c_cc[0] = orig_termios.c_cc[8];
      raw.c_cc[1] = orig_termios.c_cc[9];
      raw.c_cc[2] = orig_termios.c_cc[10];
      raw.c_cc[3] = orig_termios.c_cc[0xb];
      raw.c_cc[4] = orig_termios.c_cc[0xc];
      raw.c_cc[5] = orig_termios.c_cc[0xd];
      raw.c_cc[6] = orig_termios.c_cc[0xe];
      raw.c_cc[0x17] = orig_termios.c_cc[0x1f];
      raw.c_cc[0x18] = orig_termios._49_1_;
      raw.c_cc[0x19] = orig_termios._50_1_;
      raw.c_cc[0x1a] = orig_termios._51_1_;
      raw._44_8_ = orig_termios._52_8_;
      raw.c_cc[7] = orig_termios.c_cc[0xf];
      raw.c_cc[8] = orig_termios.c_cc[0x10];
      raw.c_cc[9] = orig_termios.c_cc[0x11];
      raw.c_cc[10] = orig_termios.c_cc[0x12];
      raw.c_cc[0xb] = orig_termios.c_cc[0x13];
      raw.c_cc[0xc] = orig_termios.c_cc[0x14];
      raw.c_cc[0xd] = orig_termios.c_cc[0x15];
      raw.c_cc[0xe] = orig_termios.c_cc[0x16];
      raw.c_cc[0xf] = orig_termios.c_cc[0x17];
      raw.c_cc[0x10] = orig_termios.c_cc[0x18];
      raw.c_cc[0x11] = orig_termios.c_cc[0x19];
      raw.c_cc[0x12] = orig_termios.c_cc[0x1a];
      raw.c_cc[0x13] = orig_termios.c_cc[0x1b];
      raw.c_cc[0x14] = orig_termios.c_cc[0x1c];
      raw.c_cc[0x15] = orig_termios.c_cc[0x1d];
      raw.c_cc[0x16] = orig_termios.c_cc[0x1e];
      auStack_58 = (undefined1  [8])(orig_termios._0_8_ & 0xfffffffefffffacd);
      raw._0_8_ = orig_termios._8_8_ & 0xffff7ff4ffffffff | 0x30;
      raw._8_6_ = orig_termios._16_6_;
      raw.c_lflag._2_2_ = 0x100;
      iVar1 = tcsetattr(fd,2,(termios *)auStack_58);
      if (-1 < iVar1) {
        ls.rawmode = 1;
        return 0;
      }
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x19;
  return -1;
}

Assistant:

int linenoiseEnableRawMode(int fd) {
    struct termios raw;

    if (!isatty(STDIN_FILENO)) goto fatal;
    if (!atexit_registered) {
        atexit(linenoiseAtExit);
        atexit_registered = 1;
    }
    if (tcgetattr(fd,&orig_termios) == -1) goto fatal;

    raw = orig_termios;  /* modify the original mode */
    /* input modes: no break, no CR to NL, no parity check, no strip char,
     * no start/stop output control. */
    raw.c_iflag &= ~(BRKINT | ICRNL | INPCK | ISTRIP | IXON);
    /* output modes - disable post processing */
    raw.c_oflag &= ~(OPOST);
    /* control modes - set 8 bit chars */
    raw.c_cflag |= (CS8);
    /* local modes - choing off, canonical off, no extended functions,
     * no signal chars (^Z,^C) */
    raw.c_lflag &= ~(ECHO | ICANON | IEXTEN | ISIG);
    /* control chars - set return condition: min number of bytes and timer.
     * We want read to return every single byte, without timeout. */
    raw.c_cc[VMIN] = 1; raw.c_cc[VTIME] = 0; /* 1 byte, no timer */

    /* put terminal in raw mode after flushing */
    if (tcsetattr(fd,TCSAFLUSH,&raw) < 0) goto fatal;
    ls.rawmode = 1;
    return 0;

fatal:
    errno = ENOTTY;
    return -1;
}